

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O1

GLuint deqp::gls::MultiTextureSamplerTest::createTextureCube(Functions *gl,int id)

{
  GLuint GVar1;
  GLenum GVar2;
  deUint32 dVar3;
  int face;
  long lVar4;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar5;
  undefined1 local_1b8 [8];
  undefined1 *puStack_1b0;
  undefined1 *local_19c;
  undefined1 *puStack_194;
  GLuint texture;
  TextureCube refTexture;
  
  texture = 0xffffffff;
  local_1b8._0_4_ = RGBA;
  local_1b8._4_4_ = UNORM_INT8;
  tcu::TextureCube::TextureCube(&refTexture,(TextureFormat *)local_1b8,0x20);
  (*gl->genTextures)(1,&texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3c0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_POSITIVE_X,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_POSITIVE_Y,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_POSITIVE_Z,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_NEGATIVE_X,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_NEGATIVE_Y,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_NEGATIVE_Z,0);
  if (id == 0) {
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    puStack_1b0 = (undefined1 *)0x0;
    local_19c = &DAT_3f0000003f000000;
    puStack_194 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[1].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    puStack_1b0 = (undefined1 *)0x0;
    local_19c = &DAT_3f0000003f000000;
    puStack_194 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[3].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    puStack_1b0 = (undefined1 *)0x0;
    local_19c = &DAT_3f0000003f000000;
    puStack_194 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[5].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    puStack_1b0 = (undefined1 *)0x0;
    local_19c = &DAT_3f0000003f000000;
    puStack_194 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[0].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    puStack_1b0 = (undefined1 *)0x0;
    local_19c = &DAT_3f0000003f000000;
    puStack_194 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[2].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8._0_4_ = R;
    local_1b8._4_4_ = SNORM_INT8;
    puStack_1b0 = (undefined1 *)0x0;
    local_19c = &DAT_3f0000003f000000;
    puStack_194 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[4].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
  }
  else if (id == 1) {
    local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
    puStack_1b0 = &DAT_3f0000003f000000;
    local_19c = &DAT_3f8000003f800000;
    puStack_194 = &DAT_3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[1].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
    puStack_1b0 = &DAT_3f0000003f000000;
    local_19c = &DAT_3f8000003f800000;
    puStack_194 = &DAT_3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[3].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
    puStack_1b0 = &DAT_3f0000003f000000;
    local_19c = &DAT_3f8000003f800000;
    puStack_194 = &DAT_3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[5].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
    puStack_1b0 = &DAT_3f0000003f000000;
    local_19c = &DAT_3f8000003f800000;
    puStack_194 = &DAT_3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[0].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
    puStack_1b0 = &DAT_3f0000003f000000;
    local_19c = &DAT_3f8000003f800000;
    puStack_194 = &DAT_3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[2].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
    local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
    puStack_1b0 = &DAT_3f0000003f000000;
    local_19c = &DAT_3f8000003f800000;
    puStack_194 = &DAT_3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.m_access[4].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_1b8,(Vec4 *)&local_19c);
  }
  (*gl->bindTexture)(0x8513,texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture(GL_TEXTURE_CUBE_MAP, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3e2);
  pvVar5 = refTexture.m_access;
  lVar4 = 0;
  do {
    dVar3 = glu::getGLCubeFace((CubeFace)lVar4);
    (*gl->texImage2D)(dVar3,0,0x8058,refTexture.m_size,refTexture.m_size,0,0x1908,0x1401,
                      (((pvVar5->
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                      m_data);
    lVar4 = lVar4 + 1;
    pvVar5 = pvVar5 + 1;
  } while (lVar4 != 6);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3e9);
  (*gl->generateMipmap)(0x8513);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenerateMipmap(GL_TEXTURE_CUBE_MAP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3ec);
  (*gl->bindTexture)(0x8513,0);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture(GL_TEXTURE_CUBE_MAP, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3ee);
  GVar1 = texture;
  tcu::TextureCube::~TextureCube(&refTexture);
  return GVar1;
}

Assistant:

GLuint MultiTextureSamplerTest::createTextureCube (const glw::Functions& gl, int id)
{
	GLuint				texture		= (GLuint)-1;
	tcu::TextureCube	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), CUBEMAP_SIZE);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures(1, &texture)");

	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Z, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Z, 0);

	switch (id)
	{
		case 0:
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f));
			break;

		case 1:
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_X), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Y), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Z), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_X), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Y), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Z), tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
			break;

		default:
			DE_ASSERT(false);
	}

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, texture)");

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		const deUint32 target = glu::getGLCubeFace((tcu::CubeFace)face);
		gl.texImage2D(target, 0, GL_RGBA8, refTexture.getSize(), refTexture.getSize(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevelFace(0, (tcu::CubeFace)face).getDataPtr());
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed");

	gl.generateMipmap(GL_TEXTURE_CUBE_MAP);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_CUBE_MAP)");
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, 0)");

	return texture;
}